

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * anon_unknown.dwarf_aa461::CreateMod
                    (VmModule *module,SynBase *source,VmValue *lhs,VmValue *rhs)

{
  bool bVar1;
  VmInstruction *pVVar2;
  VmType type;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar3;
  VmValue *rhs_local;
  VmValue *lhs_local;
  SynBase *source_local;
  VmModule *module_local;
  
  bVar1 = VmType::operator==(&lhs->type,&VmType::Int);
  uVar3 = true;
  if (!bVar1) {
    bVar1 = VmType::operator==(&lhs->type,&VmType::Double);
    uVar3 = true;
    if (!bVar1) {
      uVar3 = VmType::operator==(&lhs->type,&VmType::Long);
    }
  }
  if ((bool)uVar3 == false) {
    __assert_fail("lhs->type == VmType::Int || lhs->type == VmType::Double || lhs->type == VmType::Long"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x254,
                  "VmValue *(anonymous namespace)::CreateMod(VmModule *, SynBase *, VmValue *, VmValue *)"
                 );
  }
  bVar1 = VmType::operator==(&lhs->type,&rhs->type);
  if (!bVar1) {
    __assert_fail("lhs->type == rhs->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x255,
                  "VmValue *(anonymous namespace)::CreateMod(VmModule *, SynBase *, VmValue *, VmValue *)"
                 );
  }
  type.structType = (TypeBase *)0x27;
  type._0_8_ = (lhs->type).structType;
  pVVar2 = CreateInstruction((anon_unknown_dwarf_aa461 *)module,(VmModule *)source,
                             *(SynBase **)&lhs->type,type,(VmInstructionType)lhs,rhs,
                             (VmValue *)CONCAT17(uVar3,in_stack_ffffffffffffffc0));
  return &pVVar2->super_VmValue;
}

Assistant:

VmValue* CreateMod(VmModule *module, SynBase *source, VmValue *lhs, VmValue *rhs)
	{
		assert(lhs->type == VmType::Int || lhs->type == VmType::Double || lhs->type == VmType::Long);
		assert(lhs->type == rhs->type);

		return CreateInstruction(module, source, lhs->type, VM_INST_MOD, lhs, rhs);
	}